

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O2

JSValue js_worker_postMessage(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int *piVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  void *pvVar6;
  uint8_t *__src;
  long *__ptr;
  void *__dest;
  ulong uVar7;
  ssize_t sVar8;
  uint8_t ch;
  uint8_t **sab_tab;
  size_t local_50;
  void *local_48;
  size_t sab_tab_len;
  size_t data_len;
  
  pvVar6 = JS_GetOpaque2(ctx,this_val,js_worker_class_id);
  uVar7 = 6;
  if (pvVar6 != (void *)0x0) {
    __src = JS_WriteObject2(ctx,&data_len,*argv,0xc,&sab_tab,&sab_tab_len);
    if (__src != (uint8_t *)0x0) {
      __ptr = (long *)malloc(0x30);
      if (__ptr != (long *)0x0) {
        __ptr[4] = 0;
        local_48 = pvVar6;
        pvVar6 = malloc(data_len);
        __ptr[2] = (long)pvVar6;
        if (pvVar6 != (void *)0x0) {
          memcpy(pvVar6,__src,data_len);
          __ptr[3] = data_len;
          local_50 = sab_tab_len * 8;
          __dest = malloc(local_50);
          __ptr[4] = (long)__dest;
          if (__dest != (void *)0x0) {
            memcpy(__dest,sab_tab,local_50);
            __ptr[5] = sab_tab_len;
            js_free(ctx,__src);
            js_free(ctx,sab_tab);
            for (uVar7 = 0; uVar7 < sab_tab_len; uVar7 = uVar7 + 1) {
              LOCK();
              piVar1 = (int *)(*(long *)(__ptr[4] + uVar7 * 8) + -8);
              *piVar1 = *piVar1 + 1;
              UNLOCK();
              sab_tab_len = __ptr[5];
            }
            lVar3 = *(long *)((long)local_48 + 8);
            pthread_mutex_lock((pthread_mutex_t *)(lVar3 + 8));
            plVar2 = (long *)(lVar3 + 0x30);
            if (*(long **)(lVar3 + 0x38) == plVar2) {
              ch = '\0';
              do {
                sVar8 = write(*(int *)(lVar3 + 0x44),&ch,1);
                if ((int)sVar8 == 1) break;
              } while (-1 < (int)sVar8);
            }
            lVar4 = *plVar2;
            *(long **)(lVar4 + 8) = __ptr;
            *__ptr = lVar4;
            __ptr[1] = (long)plVar2;
            *plVar2 = (long)__ptr;
            pthread_mutex_unlock((pthread_mutex_t *)(lVar3 + 8));
            uVar7 = 3;
            goto LAB_00110020;
          }
        }
        free(pvVar6);
        free(__ptr);
      }
      js_free(ctx,__src);
      js_free(ctx,sab_tab);
    }
  }
LAB_00110020:
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar7;
  return (JSValue)(auVar5 << 0x40);
}

Assistant:

static JSValue js_worker_postMessage(JSContext *ctx, JSValueConst this_val,
                                     int argc, JSValueConst *argv)
{
    JSWorkerData *worker = JS_GetOpaque2(ctx, this_val, js_worker_class_id);
    JSWorkerMessagePipe *ps;
    size_t data_len, sab_tab_len, i;
    uint8_t *data;
    JSWorkerMessage *msg;
    uint8_t **sab_tab;
    
    if (!worker)
        return JS_EXCEPTION;
    
    data = JS_WriteObject2(ctx, &data_len, argv[0],
                           JS_WRITE_OBJ_SAB | JS_WRITE_OBJ_REFERENCE,
                           &sab_tab, &sab_tab_len);
    if (!data)
        return JS_EXCEPTION;

    msg = malloc(sizeof(*msg));
    if (!msg)
        goto fail;
    msg->data = NULL;
    msg->sab_tab = NULL;

    /* must reallocate because the allocator may be different */
    msg->data = malloc(data_len);
    if (!msg->data)
        goto fail;
    memcpy(msg->data, data, data_len);
    msg->data_len = data_len;

    msg->sab_tab = malloc(sizeof(msg->sab_tab[0]) * sab_tab_len);
    if (!msg->sab_tab)
        goto fail;
    memcpy(msg->sab_tab, sab_tab, sizeof(msg->sab_tab[0]) * sab_tab_len);
    msg->sab_tab_len = sab_tab_len;

    js_free(ctx, data);
    js_free(ctx, sab_tab);
    
    /* increment the SAB reference counts */
    for(i = 0; i < msg->sab_tab_len; i++) {
        js_sab_dup(NULL, msg->sab_tab[i]);
    }

    ps = worker->send_pipe;
    pthread_mutex_lock(&ps->mutex);
    /* indicate that data is present */
    if (list_empty(&ps->msg_queue)) {
        uint8_t ch = '\0';
        int ret;
        for(;;) {
            ret = write(ps->write_fd, &ch, 1);
            if (ret == 1)
                break;
            if (ret < 0 && (errno != EAGAIN || errno != EINTR))
                break;
        }
    }
    list_add_tail(&msg->link, &ps->msg_queue);
    pthread_mutex_unlock(&ps->mutex);
    return JS_UNDEFINED;
 fail:
    if (msg) {
        free(msg->data);
        free(msg->sab_tab);
        free(msg);
    }
    js_free(ctx, data);
    js_free(ctx, sab_tab);
    return JS_EXCEPTION;
    
}